

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPool::TryFindSymbolInFallbackDatabase
          (DescriptorPool *this,string_view name,DeferredValidation *deferred_validation)

{
  DescriptorDatabase *pDVar1;
  string_view sVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  pointer pTVar7;
  string *this_00;
  FileDescriptor *pFVar8;
  bool bVar9;
  allocator<char> local_69;
  string local_68 [32];
  DescriptorPool *local_48;
  size_t local_40;
  FileDescriptorProto *local_38;
  FileDescriptorProto *file_proto;
  DeferredValidation *deferred_validation_local;
  DescriptorPool *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (DescriptorPool *)name._M_len;
  if (this->fallback_database_ == (DescriptorDatabase *)0x0) {
    name_local._M_str._7_1_ = false;
  }
  else {
    file_proto = (FileDescriptorProto *)deferred_validation;
    deferred_validation_local = (DeferredValidation *)this;
    pTVar7 = std::
             unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             ::operator->(&this->tables_);
    bVar4 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
            ::contains<std::basic_string_view<char,std::char_traits<char>>>
                      ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                        *)&pTVar7->known_bad_symbols_,
                       (key_arg<std::basic_string_view<char>_> *)&this_local);
    if (bVar4) {
      name_local._M_str._7_1_ = false;
    }
    else {
      local_38 = DeferredValidation::CreateProto((DeferredValidation *)file_proto);
      local_48 = this_local;
      local_40 = name_local._M_len;
      sVar2._M_str = (char *)name_local._M_len;
      sVar2._M_len = (size_t)this_local;
      bVar5 = IsSubSymbolOfBuiltType(this,sVar2);
      bVar3 = false;
      bVar4 = false;
      bVar9 = true;
      if (!bVar5) {
        pDVar1 = this->fallback_database_;
        std::allocator<char>::allocator();
        bVar3 = true;
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  (local_68,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                   &local_69);
        bVar4 = true;
        uVar6 = (*pDVar1->_vptr_DescriptorDatabase[3])(pDVar1,local_68,local_38);
        bVar9 = true;
        if ((uVar6 & 1) != 0) {
          pTVar7 = std::
                   unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                   ::operator->(&this->tables_);
          this_00 = FileDescriptorProto::name_abi_cxx11_(local_38);
          sVar2 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
          pFVar8 = Tables::FindFile(pTVar7,sVar2);
          bVar9 = true;
          if (pFVar8 == (FileDescriptor *)0x0) {
            pFVar8 = BuildFileFromDatabase(this,local_38,(DeferredValidation *)file_proto);
            bVar9 = pFVar8 == (FileDescriptor *)0x0;
          }
        }
      }
      if (bVar4) {
        std::__cxx11::string::~string(local_68);
      }
      if (bVar3) {
        std::allocator<char>::~allocator(&local_69);
      }
      if (bVar9) {
        name_local._M_str._7_1_ = false;
      }
      else {
        name_local._M_str._7_1_ = true;
      }
    }
  }
  return name_local._M_str._7_1_;
}

Assistant:

bool DescriptorPool::TryFindSymbolInFallbackDatabase(
    absl::string_view name, DeferredValidation& deferred_validation) const {
  if (fallback_database_ == nullptr) return false;

  if (tables_->known_bad_symbols_.contains(name)) return false;

  auto& file_proto = deferred_validation.CreateProto();
  if (  // We skip looking in the fallback database if the name is a sub-symbol
        // of any descriptor that already exists in the descriptor pool (except
        // for package descriptors).  This is valid because all symbols except
        // for packages are defined in a single file, so if the symbol exists
        // then we should already have its definition.
        //
        // The other reason to do this is to support "overriding" type
        // definitions by merging two databases that define the same type. (Yes,
        // people do this.)  The main difficulty with making this work is that
        // FindFileContainingSymbol() is allowed to return both false positives
        // (e.g., SimpleDescriptorDatabase, UpgradedDescriptorDatabase) and
        // false negatives (e.g. ProtoFileParser, SourceTreeDescriptorDatabase).
        // When two such databases are merged, looking up a non-existent
        // sub-symbol of a type that already exists in the descriptor pool can
        // result in an attempt to load multiple definitions of the same type.
        // The check below avoids this.
      IsSubSymbolOfBuiltType(name)

      // Look up file containing this symbol in fallback database.
      || !fallback_database_->FindFileContainingSymbol(std::string(name),
                                                       &file_proto)

      // Check if we've already built this file. If so, it apparently doesn't
      // contain the symbol we're looking for.  Some DescriptorDatabases
      // return false positives.
      || tables_->FindFile(file_proto.name()) != nullptr

      // Build the file.
      || BuildFileFromDatabase(file_proto, deferred_validation) == nullptr) {
    return false;
  }

  return true;
}